

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_hv_accept.cpp
# Opt level: O3

int __thiscall
ir_assignment::accept(ir_assignment *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  ir_rvalue *piVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,__fd);
  iVar2 = (**(code **)(*plVar4 + 0xc0))(plVar4,this);
  if (iVar2 == 0) {
    *(undefined1 *)(plVar4 + 6) = 1;
    iVar2 = (*(this->lhs->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[3])
                      (this->lhs,plVar4);
    *(undefined1 *)(plVar4 + 6) = 0;
    if ((iVar2 == 0) &&
       (iVar2 = (*(this->rhs->super_ir_instruction)._vptr_ir_instruction[3])(this->rhs,plVar4),
       iVar2 == 0)) {
      piVar1 = this->condition;
      if ((piVar1 != (ir_rvalue *)0x0) &&
         (iVar2 = (*(piVar1->super_ir_instruction)._vptr_ir_instruction[3])(piVar1,plVar4),
         iVar2 == 2)) {
        return 2;
      }
      iVar2 = (**(code **)(*plVar4 + 200))(plVar4,this);
      return iVar2;
    }
  }
  iVar3 = 0;
  if (iVar2 != 1) {
    iVar3 = iVar2;
  }
  return iVar3;
}

Assistant:

ir_visitor_status
ir_assignment::accept(ir_hierarchical_visitor *v)
{
   ir_visitor_status s = v->visit_enter(this);
   if (s != visit_continue)
      return (s == visit_continue_with_parent) ? visit_continue : s;

   v->in_assignee = true;
   s = this->lhs->accept(v);
   v->in_assignee = false;
   if (s != visit_continue)
      return (s == visit_continue_with_parent) ? visit_continue : s;

   s = this->rhs->accept(v);
   if (s != visit_continue)
      return (s == visit_continue_with_parent) ? visit_continue : s;

   if (this->condition)
      s = this->condition->accept(v);

   return (s == visit_stop) ? s : v->visit_leave(this);
}